

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O3

void __thiscall capnp::_::PackedInputStream::skip(PackedInputStream *this,size_t bytes)

{
  ArrayPtr<const_unsigned_char> AVar1;
  ArrayPtr<const_unsigned_char> AVar2;
  ArrayPtr<const_unsigned_char> AVar3;
  size_t sVar4;
  int iVar5;
  byte bVar6;
  byte *pbVar7;
  uchar *puVar8;
  ulong uVar9;
  uchar *puVar10;
  uint uVar11;
  bool bVar12;
  ArrayPtr<const_unsigned_char> AVar13;
  size_t bytes_local;
  uint runLength;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Fault f;
  
  if (bytes == 0) {
    return;
  }
  bytes_local = bytes;
  AVar13 = kj::BufferedInputStream::getReadBuffer(this->inner);
LAB_0019d8f5:
  AVar3.size_ = _kjCondition.left;
  AVar3.ptr = AVar13.ptr;
  do {
    _kjCondition.left = AVar3.size_;
    pbVar7 = AVar3.ptr;
    if ((ulong)((long)(AVar13.ptr + AVar13.size_) - (long)pbVar7) < 10) {
      if (AVar13.ptr + AVar13.size_ == pbVar7) {
        (*(this->inner->super_InputStream)._vptr_InputStream[3])(this->inner,AVar13.size_);
        AVar13 = kj::BufferedInputStream::getReadBuffer(this->inner);
        _kjCondition.left = AVar13.size_;
        _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
        _kjCondition.op.content.ptr = " > ";
        _kjCondition.op.content.size_ = 4;
        _kjCondition.result = _kjCondition.left != 0;
        if (!_kjCondition.result) {
          iVar5 = 0xd0;
LAB_0019dbb4:
          _kjCondition.left = 0;
          _kjCondition.op.content.size_ = 4;
          _kjCondition.op.content.ptr = " > ";
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[31]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                     ,iVar5,FAILED,"buffer.size() > 0",
                     "_kjCondition,\"Premature end of packed input.\"",&_kjCondition,
                     (char (*) [31])"Premature end of packed input.");
          goto LAB_0019dbbe;
        }
        goto LAB_0019d8f5;
      }
      bVar6 = *pbVar7;
      pbVar7 = pbVar7 + 1;
      uVar11 = 0;
      do {
        AVar1.size_ = _kjCondition.left;
        AVar1.ptr = pbVar7;
        if ((bVar6 >> (uVar11 & 0x1f) & 1) != 0) {
          if (AVar13.ptr + AVar13.size_ == pbVar7) {
            (*(this->inner->super_InputStream)._vptr_InputStream[3])(this->inner,AVar13.size_);
            AVar13 = kj::BufferedInputStream::getReadBuffer(this->inner);
            _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
            _kjCondition.op.content.ptr = " > ";
            _kjCondition.op.content.size_ = 4;
            bVar12 = AVar13.size_ == 0;
            _kjCondition.result = !bVar12;
            AVar1 = AVar13;
            if (bVar12) {
              iVar5 = 0xdc;
              goto LAB_0019dbb4;
            }
          }
          _kjCondition.left = AVar1.size_;
          pbVar7 = AVar1.ptr + 1;
        }
        AVar3.size_ = _kjCondition.left;
        AVar3.ptr = pbVar7;
        AVar2.size_ = _kjCondition.left;
        AVar2.ptr = pbVar7;
        uVar11 = uVar11 + 1;
      } while (uVar11 != 8);
      bytes_local = bytes_local - 8;
      if ((AVar13.ptr + AVar13.size_ == pbVar7) && (AVar3 = AVar2, (byte)(bVar6 + 1) < 2)) {
        (*(this->inner->super_InputStream)._vptr_InputStream[3])(this->inner,AVar13.size_);
        AVar13 = kj::BufferedInputStream::getReadBuffer(this->inner);
        _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
        _kjCondition.op.content.ptr = " > ";
        _kjCondition.op.content.size_ = 4;
        bVar12 = AVar13.size_ == 0;
        _kjCondition.result = !bVar12;
        AVar3 = AVar13;
        if (bVar12) {
          iVar5 = 0xe4;
          goto LAB_0019dbb4;
        }
      }
    }
    else {
      bVar6 = *pbVar7;
      AVar3.size_ = _kjCondition.left;
      AVar3.ptr = pbVar7 + (ulong)(bVar6 >> 7) +
                           (ulong)((bVar6 >> 6 & 1) != 0) +
                           (ulong)(bVar6 >> 5 & 1) +
                           (ulong)((bVar6 >> 4 & 1) != 0) +
                           (ulong)(bVar6 >> 3 & 1) +
                           (ulong)((bVar6 >> 2 & 1) != 0) +
                           (ulong)(bVar6 >> 1 & 1) + (ulong)(bVar6 & 1) + 1;
      bytes_local = bytes_local - 8;
    }
    pbVar7 = AVar3.ptr;
    _kjCondition.left = (unsigned_long)&runLength;
    if (bVar6 == 0) {
      uVar9 = (ulong)*pbVar7 * 8;
      runLength = (uint)uVar9;
      _kjCondition.op.content.ptr = " <= ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = bytes_local >= uVar9;
      if (bytes_local < uVar9) {
        iVar5 = 0xfe;
LAB_0019dc46:
        _kjCondition.op.content.size_ = 5;
        _kjCondition.op.content.ptr = " <= ";
        _kjCondition._8_8_ = &bytes_local;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long&>&,char_const(&)[56]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                   ,iVar5,FAILED,"runLength <= bytes",
                   "_kjCondition,\"Packed input did not end cleanly on a segment boundary.\"",
                   (DebugComparison<unsigned_int_&,_unsigned_long_&> *)&_kjCondition,
                   (char (*) [56])"Packed input did not end cleanly on a segment boundary.");
LAB_0019dbbe:
        kj::_::Debug::Fault::~Fault(&f);
        return;
      }
      AVar3.size_ = (size_t)&runLength;
      AVar3.ptr = pbVar7 + 1;
      bytes_local = bytes_local + (ulong)*pbVar7 * -8;
      _kjCondition._8_8_ = &bytes_local;
    }
    else if (bVar6 == 0xff) {
      puVar10 = (uchar *)((ulong)*pbVar7 * 8);
      runLength = (uint)puVar10;
      _kjCondition.op.content.ptr = " <= ";
      _kjCondition.op.content.size_ = 5;
      sVar4 = bytes_local + (ulong)*pbVar7 * -8;
      _kjCondition.result = bytes_local >= puVar10;
      if (bytes_local < puVar10) {
        iVar5 = 0x109;
        goto LAB_0019dc46;
      }
      puVar8 = AVar13.ptr + (AVar13.size_ - (long)(pbVar7 + 1));
      bytes_local = sVar4;
      if (puVar8 <= puVar10) break;
      AVar3.size_ = (size_t)&runLength;
      AVar3.ptr = pbVar7 + 1 + (long)puVar10;
      _kjCondition._8_8_ = &bytes_local;
    }
    _kjCondition.left = AVar3.size_;
    if (bytes_local == 0) {
      (*(this->inner->super_InputStream)._vptr_InputStream[3])
                (this->inner,(long)AVar3.ptr - (long)AVar13.ptr);
      return;
    }
  } while( true );
  runLength = runLength - (int)puVar8;
  _kjCondition._8_8_ = &bytes_local;
  (*(this->inner->super_InputStream)._vptr_InputStream[3])
            (this->inner,AVar13.size_ + (ulong)runLength);
  if (bytes_local == 0) {
    return;
  }
  AVar13 = kj::BufferedInputStream::getReadBuffer(this->inner);
  goto LAB_0019d8f5;
}

Assistant:

void PackedInputStream::skip(size_t bytes) {
  // We can't just read into buffers because buffers must end on block boundaries.

  if (bytes == 0) {
    return;
  }

  KJ_DREQUIRE(bytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");

  kj::ArrayPtr<const byte> buffer = inner.getReadBuffer();
  const uint8_t* __restrict__ in = reinterpret_cast<const uint8_t*>(buffer.begin());

#define REFRESH_BUFFER() \
  inner.skip(buffer.size()); \
  buffer = inner.getReadBuffer(); \
  KJ_REQUIRE(buffer.size() > 0, "Premature end of packed input.") { return; } \
  in = reinterpret_cast<const uint8_t*>(buffer.begin())

  for (;;) {
    uint8_t tag;

    if (BUFFER_REMAINING < 10) {
      if (BUFFER_REMAINING == 0) {
        REFRESH_BUFFER();
        continue;
      }

      // We have at least 1, but not 10, bytes available.  We need to read slowly, doing a bounds
      // check on each byte.

      tag = *in++;

      for (uint i = 0; i < 8; i++) {
        if (tag & (1u << i)) {
          if (BUFFER_REMAINING == 0) {
            REFRESH_BUFFER();
          }
          in++;
        }
      }
      bytes -= 8;

      if (BUFFER_REMAINING == 0 && (tag == 0 || tag == 0xffu)) {
        REFRESH_BUFFER();
      }
    } else {
      tag = *in++;

#define HANDLE_BYTE(n) \
      in += (tag & (1u << n)) != 0

      HANDLE_BYTE(0);
      HANDLE_BYTE(1);
      HANDLE_BYTE(2);
      HANDLE_BYTE(3);
      HANDLE_BYTE(4);
      HANDLE_BYTE(5);
      HANDLE_BYTE(6);
      HANDLE_BYTE(7);
#undef HANDLE_BYTE

      bytes -= 8;
    }

    if (tag == 0) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= bytes, "Packed input did not end cleanly on a segment boundary.") {
        return;
      }

      bytes -= runLength;

    } else if (tag == 0xffu) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= bytes, "Packed input did not end cleanly on a segment boundary.") {
        return;
      }

      bytes -= runLength;

      size_t inRemaining = BUFFER_REMAINING;
      if (inRemaining > runLength) {
        // Fast path.
        in += runLength;
      } else {
        // Forward skip to the underlying stream.
        runLength -= inRemaining;
        inner.skip(buffer.size() + runLength);

        if (bytes == 0) {
          return;
        } else {
          buffer = inner.getReadBuffer();
          in = reinterpret_cast<const uint8_t*>(buffer.begin());

          // Skip the bounds check below since we just did the same check above.
          continue;
        }
      }
    }

    if (bytes == 0) {
      inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
      return;
    }
  }

  KJ_FAIL_ASSERT("Can't get here.");
}